

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsystemtrayicon.cpp
# Opt level: O2

void QSystemTrayIcon::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QIconPrivate *pQVar1;
  QIconPrivate *pQVar2;
  QIconPrivate *pQVar3;
  bool bVar4;
  undefined1 visible;
  MessageIcon msgIcon;
  QIcon *pQVar5;
  QString *pQVar6;
  QString *pQVar7;
  int iVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        activated((QSystemTrayIcon *)_o,*_a[1]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        messageClicked((QSystemTrayIcon *)_o);
        return;
      }
      break;
    case 2:
      visible = *_a[1];
LAB_0036d21b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setVisible((QSystemTrayIcon *)_o,(bool)visible);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        show((QSystemTrayIcon *)_o);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        hide((QSystemTrayIcon *)_o);
        return;
      }
      break;
    case 5:
      pQVar7 = (QString *)_a[1];
      pQVar6 = (QString *)_a[2];
      pQVar5 = (QIcon *)_a[3];
      iVar8 = *_a[4];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0036d309:
        showMessage((QSystemTrayIcon *)_o,pQVar7,pQVar6,pQVar5,iVar8);
        return;
      }
      break;
    case 6:
      pQVar7 = (QString *)_a[1];
      pQVar6 = (QString *)_a[2];
      pQVar5 = (QIcon *)_a[3];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        iVar8 = 10000;
        goto LAB_0036d309;
      }
      break;
    case 7:
      pQVar7 = (QString *)_a[1];
      pQVar6 = (QString *)_a[2];
      msgIcon = *_a[3];
      iVar8 = *_a[4];
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      goto LAB_0036d362;
    case 8:
      pQVar7 = (QString *)_a[1];
      pQVar6 = (QString *)_a[2];
      msgIcon = *_a[3];
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      goto LAB_0036d359;
    case 9:
      pQVar7 = (QString *)_a[1];
      pQVar6 = (QString *)_a[2];
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) break;
      msgIcon = Information;
LAB_0036d359:
      iVar8 = 10000;
LAB_0036d362:
      showMessage((QSystemTrayIcon *)_o,pQVar7,pQVar6,msgIcon,iVar8);
      return;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QSystemTrayIconPrivate::_q_emitActivated(*(QSystemTrayIconPrivate **)(_o + 8),*_a[1]);
        return;
      }
      break;
    default:
      goto switchD_0036d02a_caseD_3;
    }
    goto LAB_0036d36e;
  case ReadProperty:
    pQVar5 = (QIcon *)*_a;
    if (_id == 2) {
      *(undefined1 *)&pQVar5->d = *(undefined1 *)(*(long *)(_o + 8) + 0xb8);
    }
    else if (_id == 1) {
      icon((QSystemTrayIcon *)&local_38);
      QIcon::operator=(pQVar5,(QIcon *)&local_38);
      QIcon::~QIcon((QIcon *)&local_38);
    }
    else if (_id == 0) {
      toolTip((QString *)&local_38,(QSystemTrayIcon *)_o);
      pQVar2 = pQVar5->d;
      pQVar3 = pQVar5[1].d;
      pQVar5->d = (QIconPrivate *)local_38.d;
      pQVar5[1].d = (QIconPrivate *)local_38.ptr;
      pQVar1 = pQVar5[2].d;
      pQVar5[2].d = (QIconPrivate *)local_38.size;
      local_38.d = (Data *)pQVar2;
      local_38.ptr = (char16_t *)pQVar3;
      local_38.size = (qsizetype)pQVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    }
    break;
  case WriteProperty:
    pQVar7 = (QString *)*_a;
    if (_id == 2) {
      visible = *(undefined1 *)&(pQVar7->d).d;
      goto LAB_0036d21b;
    }
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setIcon((QSystemTrayIcon *)_o,(QIcon *)pQVar7);
        return;
      }
      goto LAB_0036d36e;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setToolTip((QSystemTrayIcon *)_o,pQVar7);
        return;
      }
      goto LAB_0036d36e;
    }
    break;
  case IndexOfMethod:
    bVar4 = QtMocHelpers::indexOfMethod<void(QSystemTrayIcon::*)(QSystemTrayIcon::ActivationReason)>
                      ((QtMocHelpers *)_a,(void **)activated,0,0);
    if (!bVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QSystemTrayIcon::*)()>
                  ((QtMocHelpers *)_a,(void **)messageClicked,0,1);
        return;
      }
      goto LAB_0036d36e;
    }
  }
switchD_0036d02a_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0036d36e:
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIcon::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSystemTrayIcon *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        case 1: _t->messageClicked(); break;
        case 2: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->show(); break;
        case 4: _t->hide(); break;
        case 5: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 6: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3]))); break;
        case 7: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 8: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3]))); break;
        case 9: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 10: _t->d_func()->_q_emitActivated((*reinterpret_cast< std::add_pointer_t<QPlatformSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)(QSystemTrayIcon::ActivationReason )>(_a, &QSystemTrayIcon::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)()>(_a, &QSystemTrayIcon::messageClicked, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}